

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O0

void GetVert(Level *NewLev,Triangle *t,int c)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  int Finished;
  
  ExpectToken(TK_OPENBRACE);
  ExpectToken(TK_OPENBRACE);
  *(undefined8 *)(in_RSI + 0x30 + (long)in_EDX * 8) = *(undefined8 *)(in_RDI + 0xe8);
  while( true ) {
    iVar1 = Token.IQuantity;
    bVar2 = *(long *)(in_RSI + 0x30 + (long)in_EDX * 8) != 0;
    if (bVar2) {
      Token.IQuantity = Token.IQuantity + -1;
    }
    if (!bVar2 || iVar1 == 0) break;
    *(undefined8 *)(in_RSI + 0x30 + (long)in_EDX * 8) =
         *(undefined8 *)(*(long *)(in_RSI + 0x30 + (long)in_EDX * 8) + 0x30);
  }
  if (Token.IQuantity == -1) {
    ExpectToken(TK_OPENBRACE);
    ExpectToken(TK_OPENBRACE);
    *(int *)(in_RSI + 0x48 + (long)in_EDX * 4) = (Token.IQuantity * screen_height) / 0x1e0;
    GetToken();
    if (Token.Type != TK_CLOSEBRACE) {
      if (Token.Type == TK_COMMA) {
        bVar2 = false;
        while (!bVar2) {
          GetToken();
          if (Token.Type == TK_CLOSEBRACE) {
            bVar2 = true;
          }
          else {
            if (Token.Type != TK_STRING) {
              Error = 1;
              return;
            }
            iVar1 = strcmp(Token.Text,"edge");
            if (iVar1 == 0) {
              *(uint *)(in_RSI + 0x48 + (long)in_EDX * 4) =
                   *(uint *)(in_RSI + 0x48 + (long)in_EDX * 4) | 0x80;
            }
            iVar1 = strcmp(Token.Text,"collidable");
            if (iVar1 == 0) {
              *(uint *)(in_RSI + 0x48 + (long)in_EDX * 4) =
                   *(uint *)(in_RSI + 0x48 + (long)in_EDX * 4) | 0x100;
            }
            iVar1 = strcmp(Token.Text,"foreground");
            if (iVar1 == 0) {
              *(uint *)(in_RSI + 0x48 + (long)in_EDX * 4) =
                   *(uint *)(in_RSI + 0x48 + (long)in_EDX * 4) | 0x200;
            }
          }
        }
      }
      else {
        Error = 1;
      }
    }
  }
  else {
    Error = 1;
    snprintf(ErrorText,0x400,"Unknown vertex referenced at line %d",(ulong)(uint)Lines);
  }
  return;
}

Assistant:

static void GetVert(struct Level *NewLev, struct Triangle *t, int c)
{
   ExpectToken(TK_OPENBRACE);

   ExpectToken(TK_NUMBER);
   t->Edges[c] = NewLev->AllVerts;
   while (t->Edges[c] && Token.IQuantity--)
      t->Edges[c] = t->Edges[c]->Next;

   if (Token.IQuantity != -1) {
      Error = 1;
      snprintf(ErrorText, sizeof(ErrorText),
                "Unknown vertex referenced at line %d", Lines);
      return;
   }
   ExpectToken(TK_COMMA);

   ExpectToken(TK_NUMBER);
   t->EdgeFlags[c] = (Token.IQuantity * screen_height) / 480;

   GetToken();
   switch (Token.Type) {
      case TK_COMMA:
         {
            int Finished = false;

            while (!Finished) {
               GetToken();
               switch (Token.Type) {
                  case TK_CLOSEBRACE:
                     Finished = true;
                     break;
                  case TK_STRING:
                     if (!strcmp(Token.Text, "edge"))
                        t->EdgeFlags[c] |= TRIFLAGS_EDGE;
                     if (!strcmp(Token.Text, "collidable"))
                        t->EdgeFlags[c] |= FLAGS_COLLIDABLE;
                     if (!strcmp(Token.Text, "foreground"))
                        t->EdgeFlags[c] |= FLAGS_FOREGROUND;
                     break;
                  default:
                     Error = 1;
                     return;
               }
            }
         }
         break;
      case TK_CLOSEBRACE:
         break;
      default:
         Error = 1;
         return;
   }
}